

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O2

int secp256k1_ecmult_strauss_batch
              (secp256k1_callback *error_callback,secp256k1_scratch *scratch,secp256k1_gej *r,
              secp256k1_scalar *inp_g_sc,secp256k1_ecmult_multi_callback *cb,void *cbdata,
              size_t n_points,size_t cb_offset)

{
  size_t checkpoint;
  secp256k1_gej *a;
  secp256k1_scalar *na;
  secp256k1_fe *psVar1;
  secp256k1_ge *psVar2;
  undefined4 uVar3;
  int iVar4;
  ulong uVar5;
  secp256k1_scalar *psVar6;
  secp256k1_gej *r_00;
  size_t sVar7;
  undefined1 auVar8 [16];
  secp256k1_strauss_state state;
  secp256k1_ge point;
  
  checkpoint = secp256k1_scratch_checkpoint(error_callback,scratch);
  secp256k1_gej_set_infinity(r);
  iVar4 = 1;
  uVar5 = (ulong)inp_g_sc | n_points;
  if (uVar5 != 0) {
    a = (secp256k1_gej *)secp256k1_scratch_alloc(error_callback,scratch,n_points * 0x98);
    uVar3 = (undefined4)uVar5;
    na = (secp256k1_scalar *)secp256k1_scratch_alloc(error_callback,scratch,n_points << 5);
    psVar1 = (secp256k1_fe *)secp256k1_scratch_alloc(error_callback,scratch,n_points * 0x180);
    state.aux = psVar1;
    psVar2 = (secp256k1_ge *)secp256k1_scratch_alloc(error_callback,scratch,n_points * 0x340);
    state.pre_a = psVar2;
    state.ps = (secp256k1_strauss_point_state *)
               secp256k1_scratch_alloc(error_callback,scratch,n_points * 0x410);
    auVar8._0_4_ = -(uint)((int)((ulong)a >> 0x20) == 0 && (int)a == 0);
    auVar8._4_4_ = -(uint)((int)na == 0 && (int)((ulong)na >> 0x20) == 0);
    auVar8._8_4_ = -(uint)((int)((ulong)psVar1 >> 0x20) == 0 && (int)psVar1 == 0);
    auVar8._12_4_ = -(uint)((int)psVar2 == 0 && (int)((ulong)psVar2 >> 0x20) == 0);
    iVar4 = movmskps(uVar3,auVar8);
    if (iVar4 == 0 && state.ps != (secp256k1_strauss_point_state *)0x0) {
      psVar6 = na;
      r_00 = a;
      for (sVar7 = 0; n_points != sVar7; sVar7 = sVar7 + 1) {
        iVar4 = (*cb)(psVar6,&point,cb_offset + sVar7,cbdata);
        if (iVar4 == 0) goto LAB_00135517;
        secp256k1_gej_set_ge(r_00,&point);
        psVar6 = psVar6 + 1;
        r_00 = r_00 + 1;
      }
      secp256k1_ecmult_strauss_wnaf(&state,r,n_points,a,na,inp_g_sc);
      secp256k1_scratch_apply_checkpoint(error_callback,scratch,checkpoint);
      iVar4 = 1;
    }
    else {
LAB_00135517:
      secp256k1_scratch_apply_checkpoint(error_callback,scratch,checkpoint);
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

static int secp256k1_ecmult_strauss_batch(const secp256k1_callback* error_callback, secp256k1_scratch *scratch, secp256k1_gej *r, const secp256k1_scalar *inp_g_sc, secp256k1_ecmult_multi_callback cb, void *cbdata, size_t n_points, size_t cb_offset) {
    secp256k1_gej* points;
    secp256k1_scalar* scalars;
    struct secp256k1_strauss_state state;
    size_t i;
    const size_t scratch_checkpoint = secp256k1_scratch_checkpoint(error_callback, scratch);

    secp256k1_gej_set_infinity(r);
    if (inp_g_sc == NULL && n_points == 0) {
        return 1;
    }

    /* We allocate STRAUSS_SCRATCH_OBJECTS objects on the scratch space. If these
     * allocations change, make sure to update the STRAUSS_SCRATCH_OBJECTS
     * constant and strauss_scratch_size accordingly. */
    points = (secp256k1_gej*)secp256k1_scratch_alloc(error_callback, scratch, n_points * sizeof(secp256k1_gej));
    scalars = (secp256k1_scalar*)secp256k1_scratch_alloc(error_callback, scratch, n_points * sizeof(secp256k1_scalar));
    state.aux = (secp256k1_fe*)secp256k1_scratch_alloc(error_callback, scratch, n_points * ECMULT_TABLE_SIZE(WINDOW_A) * sizeof(secp256k1_fe));
    state.pre_a = (secp256k1_ge*)secp256k1_scratch_alloc(error_callback, scratch, n_points * ECMULT_TABLE_SIZE(WINDOW_A) * sizeof(secp256k1_ge));
    state.ps = (struct secp256k1_strauss_point_state*)secp256k1_scratch_alloc(error_callback, scratch, n_points * sizeof(struct secp256k1_strauss_point_state));

    if (points == NULL || scalars == NULL || state.aux == NULL || state.pre_a == NULL || state.ps == NULL) {
        secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
        return 0;
    }

    for (i = 0; i < n_points; i++) {
        secp256k1_ge point;
        if (!cb(&scalars[i], &point, i+cb_offset, cbdata)) {
            secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
            return 0;
        }
        secp256k1_gej_set_ge(&points[i], &point);
    }
    secp256k1_ecmult_strauss_wnaf(&state, r, n_points, points, scalars, inp_g_sc);
    secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
    return 1;
}